

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

size_t httplib::detail::get_multipart_ranges_data_length
                 (Request *req,Response *res,string *boundary,string *content_type)

{
  size_t data_length;
  size_t local_10;
  
  local_10 = 0;
  process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
            (req,res,boundary,content_type,(anon_class_8_1_b58d1f7b)&local_10,
             (anon_class_8_1_b58d1f7b)&local_10,(anon_class_8_1_b58d1f7b)&local_10);
  return local_10;
}

Assistant:

inline size_t
get_multipart_ranges_data_length(const Request &req, Response &res,
                                 const std::string &boundary,
                                 const std::string &content_type) {
  size_t data_length = 0;

  process_multipart_ranges_data(
      req, res, boundary, content_type,
      [&](const std::string &token) { data_length += token.size(); },
      [&](const char *token) { data_length += strlen(token); },
      [&](size_t /*offset*/, size_t length) {
        data_length += length;
        return true;
      });

  return data_length;
}